

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O3

bool __thiscall Clasp::SatElite::backwardSubsume(SatElite *this)

{
  OccurList *pOVar1;
  uint uVar2;
  pointer ppCVar3;
  pointer puVar4;
  Clause *pCVar5;
  Clause *other;
  bool bVar6;
  uint uVar7;
  time_t tVar8;
  ulong uVar9;
  OccurList *pOVar10;
  uint32 uVar11;
  Literal LVar12;
  uint uVar13;
  size_type sVar14;
  long lVar15;
  uint clauseId;
  uint v;
  ulong uVar16;
  uint local_84;
  Event local_48 [2];
  SatElite *local_40;
  uint local_38;
  uint local_34;
  char *__filename;
  
  bVar6 = propagateFacts(this);
  if (bVar6) {
    uVar13 = this->qFront_;
    if (uVar13 != (this->queue_).ebo_.size) {
      do {
        if ((uVar13 & 0x1fff) == 0) {
          tVar8 = time((time_t *)0x0);
          if (this->timeout_ < tVar8) break;
          uVar7 = (this->queue_).ebo_.size;
          uVar13 = this->qFront_;
          if (1000 < uVar7) {
            local_48[0] = (Event)((Event_t<Clasp::SatElite::Progress>::id_s & 0xffff) << 0xc | 0x53a
                                 );
            local_40 = this;
            local_38 = uVar13;
            local_34 = uVar7;
            SharedContext::report((this->super_SatPreprocessor).ctx_,local_48);
            uVar13 = this->qFront_;
          }
        }
        ppCVar3 = (this->super_SatPreprocessor).clauses_.ebo_.buf;
        puVar4 = (this->queue_).ebo_.buf;
        uVar7 = uVar13 + 1;
        pCVar5 = ppCVar3[puVar4[uVar13]];
        this->qFront_ = uVar7;
        if (pCVar5 != (Clause *)0x0) {
          pCVar5 = ppCVar3[puVar4[uVar13]];
          uVar13 = _DAT_00000008;
          if (pCVar5 != (Clause *)0x0) {
            uVar13 = *(uint *)&pCVar5->field_0x8 & 0xbfffffff;
            *(uint *)&pCVar5->field_0x8 = uVar13;
          }
          uVar11 = pCVar5->lits_[0].rep_;
          pOVar10 = this->occurs_;
          if (1 < (uVar13 & 0x3fffffff)) {
            lVar15 = 0;
            do {
              uVar7 = pCVar5[1].lits_[lVar15 + -3].rep_;
              if (((uint)((ulong)*(undefined8 *)&pOVar10[uVar11 >> 2].field_0x18 >> 0x20) &
                  0x3fffffff) + ((uint)*(undefined8 *)&pOVar10[uVar11 >> 2].field_0x18 & 0x3fffffff)
                  <= ((uint)((ulong)*(undefined8 *)&pOVar10[uVar7 >> 2].field_0x18 >> 0x20) &
                     0x3fffffff) +
                     ((uint)*(undefined8 *)&pOVar10[uVar7 >> 2].field_0x18 & 0x3fffffff)) {
                uVar7 = uVar11;
              }
              uVar11 = uVar7;
              lVar15 = lVar15 + 1;
            } while ((ulong)(uVar13 & 0x3fffffff) - 1 != lVar15);
          }
          uVar7 = uVar11 >> 2;
          pOVar1 = pOVar10 + uVar7;
          uVar13 = pOVar10[uVar7].refs.super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>
                   .left_;
          sVar14 = 0;
          if (3 < uVar13) {
            uVar16 = 0;
            local_84 = 0;
            do {
              uVar2 = *(uint *)((pOVar1->refs).super_type.
                                super_left_right_rep<Clasp::Literal,_unsigned_int>.buf_ + uVar16 * 4
                               );
              clauseId = uVar2 >> 2;
              __filename = (char *)(ulong)clauseId;
              other = (this->super_SatPreprocessor).clauses_.ebo_.buf[(long)__filename];
              if ((other == (Clause *)0x0) || (other == pCVar5)) {
                if (other == (Clause *)0x0) goto LAB_0019022a;
LAB_00190195:
                uVar9 = (ulong)local_84;
                local_84 = local_84 + 1;
                if (uVar16 != uVar9) {
                  *(uint *)((pOVar1->refs).super_type.
                            super_left_right_rep<Clasp::Literal,_unsigned_int>.buf_ + uVar9 * 4) =
                       uVar2;
                }
              }
              else {
                LVar12.rep_ = ((uVar11 ^ uVar2) & 2) >> 1;
                if (LVar12.rep_ != 0) {
                  LVar12.rep_ = uVar11;
                }
                LVar12 = subsumes(this,pCVar5,other,LVar12);
                if ((LVar12.rep_ ^ 2) < 2) goto LAB_00190195;
                if (LVar12.rep_ < 2) {
                  detach(this,clauseId);
                }
                else {
                  v = LVar12.rep_ >> 2;
                  OccurList::remove(this->occurs_ + v,__filename);
                  updateHeap(this,v);
                  bVar6 = strengthenClause(this,clauseId,(Literal)(LVar12.rep_ & 0xfffffffe ^ 2));
                  if (!bVar6) goto LAB_001902b7;
                  if ((v != uVar7) &&
                     ((this->super_SatPreprocessor).clauses_.ebo_.buf[(long)__filename] !=
                      (Clause *)0x0)) goto LAB_00190195;
                }
              }
LAB_0019022a:
              uVar16 = uVar16 + 1;
            } while (uVar13 >> 2 != uVar16);
            pOVar10 = this->occurs_;
            sVar14 = local_84 << 2;
          }
          (pOVar1->refs).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.left_ =
               sVar14;
          pOVar10[uVar7].field_0x1b = pOVar10[uVar7].field_0x1b & 0x7f;
          bVar6 = propagateFacts(this);
          if (!bVar6) goto LAB_001902b7;
          uVar7 = this->qFront_;
        }
        uVar13 = uVar7;
      } while (uVar7 != (this->queue_).ebo_.size);
    }
    (this->queue_).ebo_.size = 0;
    this->qFront_ = 0;
    bVar6 = true;
  }
  else {
LAB_001902b7:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool SatElite::backwardSubsume() {
	if (!propagateFacts()) return false;
	while (qFront_ != queue_.size()) {
		if ((qFront_ & 8191) == 0) {
			if (timeout()) break;
			if (queue_.size() > 1000) reportProgress(Progress::event_subsumption, qFront_, queue_.size());
		}
		if (peekSubQueue() == 0) { ++qFront_; continue; }
		Clause& c = *popSubQueue();
		// Try to minimize effort by testing against the var in c that occurs least often;
		Literal best = c[0];
		for (uint32 i = 1; i < c.size(); ++i) {
			if (occurs_[c[i].var()].numOcc() < occurs_[best.var()].numOcc()) {
				best  = c[i];
			}
		}
		// Test against all clauses containing best
		ClWList& cls = occurs_[best.var()].refs;
		Literal res  = lit_false();
		uint32  j    = 0;
		// must use index access because cls might change!
		for (uint32 i = 0, end = cls.left_size(); i != end; ++i) {
			Literal cl     = cls.left(i);
			uint32 otherId = cl.var();
			Clause* other  = clause(otherId);
			if (other && other!= &c && (res = subsumes(c, *other, best.sign()==cl.sign()?lit_true():best)) != lit_false()) {
				if (res == lit_true()) {
					// other is subsumed - remove it
					detach(otherId);
					other = 0;
				}
				else {
					// self-subsumption resolution; other is subsumed by c\{res} U {~res}
					// remove ~res from other, add it to subQ so that we can check if it now subsumes c
					res = ~res;
					occurs_[res.var()].remove(otherId, res.sign(), res.var() != best.var());
					updateHeap(res.var());
					if (!strengthenClause(otherId, res))              { return false; }
					if (res.var() == best.var() || !clause(otherId))  { other = 0; }
				}
			}
			if (other && j++ != i)  { cls.left(j-1) = cl; }
		}
		cls.shrink_left(cls.left_begin()+j);
		occurs_[best.var()].dirty = 0;
		assert(occurs_[best.var()].numOcc() == (uint32)cls.left_size());
		if (!propagateFacts()) return false;
	}
	queue_.clear();
	qFront_ = 0;
	return true;
}